

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_consumer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataConsumer::ConsumeChunks
          (ColumnDataConsumer *this,idx_t delete_index_start,idx_t delete_index_end)

{
  ColumnDataAllocator *this_00;
  ColumnDataAllocator *pCVar1;
  uint32_t block_id_00;
  uint32_t uVar2;
  reference this_01;
  reference this_02;
  uint32_t block_id;
  idx_t chunk_index;
  
  for (; delete_index_start < delete_index_end; delete_index_start = delete_index_start + 1) {
    if (delete_index_start != 0) {
      this_01 = vector<duckdb::ColumnDataConsumer::ChunkReference,_true>::get<true>
                          (&this->chunk_references,delete_index_start - 1);
      this_02 = vector<duckdb::ColumnDataConsumer::ChunkReference,_true>::get<true>
                          (&this->chunk_references,delete_index_start);
      this_00 = (this_01->segment->allocator).internal.
                super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar1 = (this_02->segment->allocator).internal.
               super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      block_id_00 = ChunkReference::GetMinimumBlockID(this_01);
      uVar2 = ChunkReference::GetMinimumBlockID(this_02);
      if (this_00 == pCVar1) {
        for (; block_id_00 < uVar2; block_id_00 = block_id_00 + 1) {
          ColumnDataAllocator::SetDestroyBufferUponUnpin(this_00,block_id_00);
        }
      }
      else {
        for (; (ulong)block_id_00 <
               (ulong)(((long)(this_00->blocks).
                              super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                              .
                              super__Vector_base<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->blocks).
                             super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                             .
                             super__Vector_base<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            block_id_00 = block_id_00 + 1) {
          ColumnDataAllocator::SetDestroyBufferUponUnpin(this_00,block_id_00);
        }
      }
    }
  }
  return;
}

Assistant:

void ColumnDataConsumer::ConsumeChunks(idx_t delete_index_start, idx_t delete_index_end) {
	for (idx_t chunk_index = delete_index_start; chunk_index < delete_index_end; chunk_index++) {
		if (chunk_index == 0) {
			continue;
		}
		auto &prev_chunk_ref = chunk_references[chunk_index - 1];
		auto &curr_chunk_ref = chunk_references[chunk_index];
		auto prev_allocator = prev_chunk_ref.segment->allocator.get();
		auto curr_allocator = curr_chunk_ref.segment->allocator.get();
		auto prev_min_block_id = prev_chunk_ref.GetMinimumBlockID();
		auto curr_min_block_id = curr_chunk_ref.GetMinimumBlockID();
		if (prev_allocator != curr_allocator) {
			// Moved to the next allocator, delete all remaining blocks in the previous one
			for (uint32_t block_id = prev_min_block_id; block_id < prev_allocator->BlockCount(); block_id++) {
				prev_allocator->SetDestroyBufferUponUnpin(block_id);
			}
			continue;
		}
		// Same allocator, see if we can delete blocks
		for (uint32_t block_id = prev_min_block_id; block_id < curr_min_block_id; block_id++) {
			prev_allocator->SetDestroyBufferUponUnpin(block_id);
		}
	}
}